

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O1

size_t obj_desc_name_format(char *buf,size_t max,size_t end,char *fmt,char *modstr,_Bool pluralise)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  byte *pbVar5;
  byte *__s;
  size_t local_58;
  uint local_4c;
  size_t local_48;
  byte *local_40;
  char *local_38;
  
  local_4c = (uint)pluralise;
  local_58 = end;
  do {
    while (bVar1 = *fmt, 0x7b < bVar1) {
      if (bVar1 != 0x7e) {
        if (bVar1 != 0x7c) goto LAB_00189ca0;
        local_40 = (byte *)fmt + 1;
        local_38 = modstr;
        pcVar3 = strchr((char *)local_40,0x7c);
        if (pcVar3 == (char *)0x0) {
          __s = (byte *)0x0;
          pbVar2 = (byte *)0x0;
        }
        else {
          __s = (byte *)(pcVar3 + 1);
          pbVar2 = (byte *)strchr((char *)__s,0x7c);
        }
        if (pbVar2 == (byte *)0x0 || __s == (byte *)0x0) {
          local_48 = local_58;
        }
        else {
          if (pluralise) {
            uVar4 = (int)pbVar2 - (int)__s;
            pbVar5 = __s;
          }
          else {
            uVar4 = ~(uint)local_40 + (int)__s;
            pbVar5 = local_40;
          }
          strnfcat(buf,max,&local_58,"%.*s",(ulong)uVar4,pbVar5);
          fmt = (char *)pbVar2;
        }
        modstr = local_38;
        if (pbVar2 == (byte *)0x0 || __s == (byte *)0x0) {
          return local_48;
        }
        goto LAB_00189d2b;
      }
      if (pluralise) {
        if ((((byte *)fmt)[-1] - 0x68 < 0x11) &&
           ((0x10801U >> (((byte *)fmt)[-1] - 0x68 & 0x1f) & 1) != 0)) {
          pcVar3 = "es";
        }
        else {
          pcVar3 = "s";
        }
        strnfcat(buf,max,&local_58,pcVar3);
      }
      else {
        fmt = (char *)((byte *)fmt + 1);
      }
      if (pluralise) {
LAB_00189d2b:
        fmt = (char *)((byte *)fmt + 1);
      }
    }
    if (bVar1 != 0x26) {
      if (bVar1 == 0) {
        buf[local_58] = '\0';
        return local_58;
      }
      if (bVar1 == 0x23) {
        local_58 = obj_desc_name_format(buf,max,local_58,modstr,(char *)0x0,SUB41(local_4c,0));
      }
      else {
LAB_00189ca0:
        buf[local_58] = bVar1;
        local_58 = local_58 + 1;
      }
      goto LAB_00189d2b;
    }
    for (; (*fmt == 0x26 || (*fmt == 0x20)); fmt = (char *)((byte *)fmt + 1)) {
    }
  } while( true );
}

Assistant:

size_t obj_desc_name_format(char *buf, size_t max, size_t end,
		const char *fmt, const char *modstr, bool pluralise)
{
	/* Copy the string */
	while (*fmt) {
		/* Skip */
		if (*fmt == '&') {
			while (*fmt == ' ' || *fmt == '&')
				fmt++;
			continue;
		} else if (*fmt == '~') {
			/* Pluralizer (regular English plurals) */
			char prev = *(fmt - 1);

			if (!pluralise)	{
				fmt++;
				continue;
			}

			/* e.g. cutlass-e-s, torch-e-s, box-e-s */
			if (prev == 's' || prev == 'h' || prev == 'x')
				strnfcat(buf, max, &end, "es");
			else
				strnfcat(buf, max, &end, "s");
		} else if (*fmt == '|') {
			/* Special plurals 
			* e.g. kni|fe|ves|
			*          ^  ^  ^ */
			const char *singular = fmt + 1;
			const char *plural   = strchr(singular, '|');
			const char *endmark  = NULL;

			if (plural) {
				plural++;
				endmark = strchr(plural, '|');
			}

			if (!singular || !plural || !endmark) return end;

			if (!pluralise)
				strnfcat(buf, max, &end, "%.*s",
					(int) (plural - singular) - 1,
					singular);
			else
				strnfcat(buf, max, &end, "%.*s",
					(int) (endmark - plural), plural);

			fmt = endmark;
		} else if (*fmt == '#') {
			/* Add modstr, with pluralisation if relevant */
			end = obj_desc_name_format(buf, max, end, modstr, NULL,	pluralise);
		}

		else
			buf[end++] = *fmt;

		fmt++;
	}

	buf[end] = 0;

	return end;
}